

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void extra_close_record(ctl_extr_rec *ctl,int ce_size)

{
  int in_ESI;
  ctl_extr_rec *in_RDI;
  uchar *unaff_retaddr;
  int padding;
  
  if (0 < in_ESI) {
    extra_tell_used_size(in_RDI,in_ESI);
  }
  if (((in_RDI->cur_len & 1U) != 0) &&
     (in_RDI->cur_len = in_RDI->cur_len + 1, in_RDI->bp != (uchar *)0x0)) {
    in_RDI->bp[in_RDI->cur_len] = '\0';
  }
  if (in_RDI->use_extr == 0) {
    in_RDI->dr_len = in_RDI->cur_len;
  }
  else if (in_RDI->ce_ptr != (uchar *)0x0) {
    set_SUSP_CE(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_ESI);
  }
  return;
}

Assistant:

static void
extra_close_record(struct ctl_extr_rec *ctl, int ce_size)
{
	int padding = 0;

	if (ce_size > 0)
		extra_tell_used_size(ctl, ce_size);
	/* Padding. */
	if (ctl->cur_len & 0x01) {
		ctl->cur_len++;
		if (ctl->bp != NULL)
			ctl->bp[ctl->cur_len] = 0;
		padding = 1;
	}
	if (ctl->use_extr) {
		if (ctl->ce_ptr != NULL)
			set_SUSP_CE(ctl->ce_ptr, ctl->extr_loc,
			    ctl->extr_off, ctl->cur_len - padding);
	} else
		ctl->dr_len = ctl->cur_len;
}